

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullReader.cpp
# Opt level: O0

StepStatus __thiscall
adios2::core::engine::NullReader::BeginStep(NullReader *this,StepMode mode,float timeoutSeconds)

{
  pointer pNVar1;
  int in_stack_fffffffffffffea4;
  string *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  pNVar1 = std::
           unique_ptr<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
           ::operator->((unique_ptr<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
                         *)0xac9248);
  if ((pNVar1->IsOpen & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Engine",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"NullReader",&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"BeginStep",&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"NullReader::BeginStep: Engine already closed",&local_b9);
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  pNVar1 = std::
           unique_ptr<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
           ::operator->((unique_ptr<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
                         *)0xac9490);
  if ((pNVar1->IsInStep & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"Engine",&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"NullReader",&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"BeginStep",&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffea8,"NullReader::BeginStep: Step already active",
               (allocator *)&stack0xfffffffffffffea7);
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffea7);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  pNVar1 = std::
           unique_ptr<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
           ::operator->((unique_ptr<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
                         *)0xac96a6);
  pNVar1->IsInStep = true;
  pNVar1 = std::
           unique_ptr<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
           ::operator->((unique_ptr<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
                         *)0xac96bb);
  pNVar1->CurrentStep = pNVar1->CurrentStep + 1;
  return EndOfStream;
}

Assistant:

StepStatus NullReader::BeginStep(StepMode mode, const float timeoutSeconds)
{
    if (!Impl->IsOpen)
    {
        helper::Throw<std::runtime_error>("Engine", "NullReader", "BeginStep",
                                          "NullReader::BeginStep: Engine already closed");
    }

    if (Impl->IsInStep)
    {
        helper::Throw<std::runtime_error>("Engine", "NullReader", "BeginStep",
                                          "NullReader::BeginStep: Step already active");
    }

    Impl->IsInStep = true;
    ++Impl->CurrentStep;
    return StepStatus::EndOfStream;
}